

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O2

void copy_rect(uint16_t *dst,int dstride,uint16_t *src,int sstride,int v,int h)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int j;
  ulong uVar4;
  
  uVar1 = 0;
  uVar3 = (ulong)(uint)h;
  if (h < 1) {
    uVar3 = uVar1;
  }
  uVar2 = (ulong)(uint)v;
  if (v < 1) {
    uVar2 = uVar1;
  }
  for (; uVar1 != uVar2; uVar1 = uVar1 + 1) {
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      dst[uVar4] = src[uVar4];
    }
    dst = dst + dstride;
    src = src + sstride;
  }
  return;
}

Assistant:

static void copy_rect(uint8_t *src, int src_stride, uint8_t *dst,
                      int dst_stride, int width, int height,
                      int use_high_bit_depth) {
  int hbd_coeff = use_high_bit_depth ? 2 : 1;
  while (height) {
    memcpy(dst, src, width * sizeof(uint8_t) * hbd_coeff);
    src += src_stride;
    dst += dst_stride;
    --height;
  }
  return;
}